

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_rect
               (nk_draw_list *list,nk_rect rect,nk_color col,float rounding,float thickness)

{
  nk_vec2 nVar1;
  nk_vec2 nVar2;
  float thickness_local;
  float rounding_local;
  nk_draw_list *list_local;
  float fStack_18;
  nk_color col_local;
  nk_rect rect_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x27c5,
                  "void nk_draw_list_stroke_rect(struct nk_draw_list *, struct nk_rect, struct nk_color, float, float)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && (list_local._7_1_ = col.a, list_local._7_1_ != '\0')) {
    fStack_18 = rect.x;
    col_local = (nk_color)rect.y;
    rect_local.x = rect.w;
    rect_local.y = rect.h;
    if (list->line_AA == NK_ANTI_ALIASING_ON) {
      nVar1 = nk_vec2(fStack_18,(float)col_local);
      nVar2 = nk_vec2(fStack_18 + rect_local.x,(float)col_local + rect_local.y);
      nk_draw_list_path_rect_to(list,nVar1,nVar2,rounding);
    }
    else {
      nVar1 = nk_vec2(fStack_18 - 0.5,(float)col_local - 0.5);
      nVar2 = nk_vec2(fStack_18 + rect_local.x,(float)col_local + rect_local.y);
      nk_draw_list_path_rect_to(list,nVar1,nVar2,rounding);
    }
    nk_draw_list_path_stroke(list,col,NK_STROKE_CLOSED,thickness);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_rect(struct nk_draw_list *list, struct nk_rect rect,
    struct nk_color col, float rounding, float thickness)
{
    NK_ASSERT(list);
    if (!list || !col.a) return;
    if (list->line_AA == NK_ANTI_ALIASING_ON) {
        nk_draw_list_path_rect_to(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
    } else {
        nk_draw_list_path_rect_to(list, nk_vec2(rect.x-0.5f, rect.y-0.5f),
            nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
    } nk_draw_list_path_stroke(list,  col, NK_STROKE_CLOSED, thickness);
}